

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetFieldOrdinal
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  pointer pbVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  LogMessage *pLVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_type *psVar8;
  bool bVar9;
  LogFinisher local_79;
  FieldDescriptor *local_78;
  undefined8 *local_70;
  LogMessage local_68;
  
  pbVar1 = (this->field_names_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->field_names_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  bVar9 = lVar5 != 0;
  local_78 = descriptor;
  if (bVar9) {
    uVar6 = lVar5 >> 5;
    local_70 = *(undefined8 **)descriptor;
    sVar2 = local_70[1];
    psVar8 = &pbVar1->_M_string_length;
    uVar7 = 0;
    do {
      __n = *psVar8;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar8 + -1))->_M_dataplus)._M_p,(void *)*local_70,__n), iVar3 == 0)))) {
        if (bVar9) goto LAB_0026aa6c;
        break;
      }
      uVar7 = uVar7 + 1;
      bVar9 = uVar7 < uVar6;
      psVar8 = psVar8 + 4;
    } while (uVar6 + (uVar6 == 0) != uVar7);
  }
  internal::LogMessage::LogMessage
            (&local_68,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_message.cc"
             ,0x21b);
  pLVar4 = internal::LogMessage::operator<<(&local_68,"Could not find ordinal for field ");
  pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)local_78);
  internal::LogFinisher::operator=(&local_79,pLVar4);
  internal::LogMessage::~LogMessage(&local_68);
  uVar7 = 0xffffffff;
LAB_0026aa6c:
  return (int)uVar7;
}

Assistant:

int MessageGenerator::GetFieldOrdinal(const FieldDescriptor* descriptor) {
  for (int i = 0; i < field_names().size(); i++) {
    if (field_names()[i] == descriptor->name()) {
      return i;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find ordinal for field " << descriptor->name();
  return -1;
}